

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O0

PList * p_hash_table_lookup_by_value(PHashTable *table,pconstpointer val,PCompareFunc func)

{
  pint pVar1;
  bool bVar2;
  uint local_3c;
  pboolean res;
  puint i;
  PHashTableNode *node;
  PList *ret;
  PCompareFunc func_local;
  pconstpointer val_local;
  PHashTable *table_local;
  
  node = (PHashTableNode *)0x0;
  if (table == (PHashTable *)0x0) {
    table_local = (PHashTable *)0x0;
  }
  else {
    for (local_3c = 0; (ulong)local_3c < table->size; local_3c = local_3c + 1) {
      for (_res = table->table[local_3c]; _res != (PHashTableNode *)0x0; _res = _res->next) {
        if (func == (PCompareFunc)0x0) {
          bVar2 = _res->value == val;
        }
        else {
          pVar1 = (*func)(_res->value,val);
          bVar2 = pVar1 == 0;
        }
        if (bVar2) {
          node = (PHashTableNode *)p_list_append((PList *)node,_res->key);
        }
      }
    }
    table_local = (PHashTable *)node;
  }
  return (PList *)table_local;
}

Assistant:

P_LIB_API PList *
p_hash_table_lookup_by_value (const PHashTable *table, pconstpointer val, PCompareFunc func)
{
	PList		*ret = NULL;
	PHashTableNode	*node;
	puint		i;
	pboolean	res;

	if (P_UNLIKELY (table == NULL))
		return NULL;

	for (i = 0; i < table->size; ++i)
		for (node = table->table[i]; node != NULL; node = node->next) {
			if (func == NULL)
				res = (node->value == val);
			else
				res = (func (node->value, val) == 0);

			if (res)
				ret = p_list_append (ret, node->key);
		}

	return ret;
}